

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O3

int sign(EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  pointer *ppuVar1;
  char cVar2;
  undefined8 uVar3;
  undefined1 __src [8];
  uint32_t uVar4;
  long *plVar5;
  undefined8 *puVar6;
  BIO *bp;
  RSA *rsa;
  uchar *sigret;
  size_type *extraout_RAX;
  size_type *psVar7;
  uint uVar8;
  long *plVar9;
  allocator_type *__a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar10;
  long lVar11;
  value_type_conflict2 *__val;
  pointer pDVar12;
  uint uVar13;
  size_t sVar14;
  undefined8 uVar15;
  ulong __n;
  void *pvVar16;
  pointer puVar17;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v_4;
  undefined1 local_598 [8];
  SHA_CTX context;
  uint8_t manifestSha [20];
  uchar local_518 [8];
  uchar sha [20];
  uchar local_4f4 [36];
  uchar digest [20];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4b8;
  vec8 local_4a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_488;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_470;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_458;
  vec8 local_440;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_428;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_410;
  vec8 local_3f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3b0;
  vec8 local_398;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_380;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_368;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_350;
  vec8 local_338;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_320;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_308;
  vec8 local_2f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2d8;
  vec8 local_2c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_290;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_278;
  vec8 local_260;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_248;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_230;
  size_type *local_218;
  string sigHead;
  vector<char,_std::allocator<char>_> digestCopy;
  string head;
  string manifestMF;
  undefined1 auStack_198 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> certMetaData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  undefined1 local_144 [8];
  uint signLen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  undefined1 local_120 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> certificate;
  undefined1 local_100 [8];
  DER certData;
  string pemKey;
  string certSF;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  ZipArchive *local_40;
  allocator_type local_35;
  allocator_type local_34;
  allocator_type local_33;
  allocator_type local_32;
  allocator_type local_31;
  
  digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&head._M_string_length;
  local_40 = (ZipArchive *)ctx;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             "Manifest-Version: 1.0\r\nCreated-By: 1.0 (Fastzip)\r\n\r\n","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&head.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)siglen);
  SHA1_Init((SHA_CTX *)local_598);
  SHA1_Update((SHA_CTX *)local_598,(void *)head.field_2._8_8_,(size_t)manifestMF._M_dataplus._M_p);
  SHA1_Final((uchar *)(context.data + 0xf),(SHA_CTX *)local_598);
  uVar4 = crc32_fast((void *)head.field_2._8_8_,(size_t)manifestMF._M_dataplus._M_p,0);
  local_100 = (undefined1  [8])&certData.children;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"META-INF/MANIFEST.MF","");
  ZipArchive::addFile(local_40,(string *)local_100,true,(uint64_t)manifestMF._M_dataplus._M_p,
                      (uint64_t)manifestMF._M_dataplus._M_p,0,uVar4,0);
  if (local_100 != (undefined1  [8])&certData.children) {
    operator_delete((void *)local_100,
                    (ulong)&(certData.children.
                             super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
                             super__Vector_impl_data._M_start)->field_0x1);
  }
  fwrite((void *)head.field_2._8_8_,1,(size_t)manifestMF._M_dataplus._M_p,(FILE *)(local_40->f).fp_)
  ;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)((long)&sigHead.field_2 + 8),siglen[1] + 1,
             (allocator_type *)local_100);
  strcpy((char *)sigHead.field_2._8_8_,(char *)*siglen);
  uVar15 = sigHead.field_2._8_8_;
LAB_00175d56:
  pvVar16 = (void *)(uVar15 + 4);
  sVar14 = 4;
  do {
    if (*(char *)((long)pvVar16 + -4) == '\r') {
      if (((*(char *)((long)pvVar16 + -3) == '\n') && (*(char *)((long)pvVar16 + -2) == '\r')) &&
         (*(char *)((long)pvVar16 + -1) == '\n')) break;
    }
    else if (*(char *)((long)pvVar16 + -4) == '\0') {
      local_218 = &sigHead._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,
                 "Signature-Version: 1.0\r\nCreated-By: 1.0 (Fastzip)\r\nSHA1-Digest-Manifest: ","")
      ;
      base64_encode_abi_cxx11_
                ((string *)((long)&certSF.field_2 + 8),(uchar *)(context.data + 0xf),0x14);
      plVar5 = (long *)std::__cxx11::string::replace
                                 ((ulong)((long)&certSF.field_2 + 8),0,(char *)0x0,(ulong)local_218)
      ;
      certData.value = (uint64_t)&pemKey._M_string_length;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        pemKey._M_string_length = *psVar7;
        pemKey.field_2._M_allocated_capacity = plVar5[3];
      }
      else {
        pemKey._M_string_length = *psVar7;
        certData.value = (uint64_t)*plVar5;
      }
      pemKey._M_dataplus._M_p = (pointer)plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&certData.value);
      uVar15 = sigHead.field_2._8_8_;
      local_100 = (undefined1  [8])&certData.children;
      plVar9 = plVar5 + 2;
      if ((vector<asn1::DER,_std::allocator<asn1::DER>_> *)*plVar5 ==
          (vector<asn1::DER,_std::allocator<asn1::DER>_> *)plVar9) {
        certData.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*plVar9;
        certData.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar5[3];
      }
      else {
        certData.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*plVar9;
        local_100 = (undefined1  [8])*plVar5;
      }
      certData._0_8_ = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      ppuVar1 = &certificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      local_120 = (undefined1  [8])ppuVar1;
      if (sigHead.field_2._8_8_ == 0) {
        lVar11 = 1;
      }
      else {
        sVar14 = strlen((char *)sigHead.field_2._8_8_);
        lVar11 = sVar14 + uVar15;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,uVar15,lVar11);
      pDVar12 = (pointer)0xf;
      if (local_100 != (undefined1  [8])&certData.children) {
        pDVar12 = certData.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      if (pDVar12 < (pointer)(certificate.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + certData._0_8_)) {
        pDVar12 = (pointer)0xf;
        if (local_120 != (undefined1  [8])ppuVar1) {
          pDVar12 = (pointer)certificate.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
        }
        if (pDVar12 < (pointer)(certificate.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + certData._0_8_))
        goto LAB_00175f9f;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)local_120,0,(char *)0x0,(ulong)local_100);
      }
      else {
LAB_00175f9f:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append(local_100,(ulong)local_120);
      }
      pemKey.field_2._8_8_ = &certSF._M_string_length;
      psVar7 = puVar6 + 2;
      if ((size_type *)*puVar6 == psVar7) {
        certSF._M_string_length = *psVar7;
        certSF.field_2._M_allocated_capacity = puVar6[3];
      }
      else {
        certSF._M_string_length = *psVar7;
        pemKey.field_2._8_8_ = (size_type *)*puVar6;
      }
      certSF._M_dataplus._M_p = (pointer)puVar6[1];
      *puVar6 = psVar7;
      puVar6[1] = 0;
      *(undefined1 *)psVar7 = 0;
      if (local_120 != (undefined1  [8])ppuVar1) {
        operator_delete((void *)local_120,
                        (ulong)(certificate.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1));
      }
      if (local_100 != (undefined1  [8])&certData.children) {
        operator_delete((void *)local_100,
                        (ulong)&(certData.children.
                                 super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
                                 super__Vector_impl_data._M_start)->field_0x1);
      }
      if ((size_type *)certData.value != &pemKey._M_string_length) {
        operator_delete((void *)certData.value,pemKey._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)certSF.field_2._8_8_ != &local_50) {
        operator_delete((void *)certSF.field_2._8_8_,local_50._M_allocated_capacity + 1);
      }
      uVar4 = crc32_fast((void *)pemKey.field_2._8_8_,(size_t)certSF._M_dataplus._M_p,0);
      local_100 = (undefined1  [8])&certData.children;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"META-INF/CERT.SF","");
      ZipArchive::addFile(local_40,(string *)local_100,true,(uint64_t)certSF._M_dataplus._M_p,
                          (uint64_t)certSF._M_dataplus._M_p,0,uVar4,0);
      if (local_100 != (undefined1  [8])&certData.children) {
        operator_delete((void *)local_100,
                        (ulong)&(certData.children.
                                 super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
                                 super__Vector_impl_data._M_start)->field_0x1);
      }
      fwrite((void *)pemKey.field_2._8_8_,1,(size_t)certSF._M_dataplus._M_p,
             (FILE *)(local_40->f).fp_);
      local_4f4[0x1c] = '\0';
      local_4f4[0x1d] = '\0';
      local_4f4[0x1e] = '\0';
      local_4f4[0x1f] = '\0';
      local_4f4[0x20] = '\0';
      local_4f4[0x21] = '\0';
      local_4f4[0x22] = '\0';
      local_4f4[0x23] = '\0';
      digest[0] = '\0';
      digest[1] = '\0';
      digest[2] = '\0';
      digest[3] = '\0';
      digest[4] = '\0';
      digest[5] = '\0';
      digest[6] = '\0';
      digest[7] = '\0';
      digest[8] = '\0';
      digest[9] = '\0';
      digest[10] = '\0';
      digest[0xb] = '\0';
      SHA1_Init((SHA_CTX *)local_598);
      SHA1_Update((SHA_CTX *)local_598,(void *)pemKey.field_2._8_8_,(size_t)certSF._M_dataplus._M_p)
      ;
      SHA1_Final(local_4f4 + 0x1c,(SHA_CTX *)local_598);
      KeyStore::getKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100,
                       (KeyStore *)sig,(string *)(sig + 0x58),(string *)(sig + 0x38));
      __src = local_100;
      manifestMF.field_2._8_8_ =
           certData.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __n = certData._0_8_ - (long)local_100;
      if (__n == 0) {
        local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        puVar17 = (pointer)0x0;
        local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        if ((long)__n < 0) {
          std::__throw_bad_alloc();
        }
        local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)operator_new(__n);
        puVar17 = local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + __n;
        local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar17;
        memmove(local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,(void *)__src,__n);
      }
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar17;
      toPem_abi_cxx11_((string *)&certData.value,&local_138);
      if (local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_138.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      stack0xfffffffffffffec0 = (vector<asn1::DER,_std::allocator<asn1::DER>_> *)__src;
      bp = BIO_new_mem_buf((void *)certData.value,-1);
      rsa = PEM_read_bio_RSAPrivateKey(bp,(RSA **)0x0,(undefined1 *)0x0,(void *)0x0);
      if (rsa == (RSA *)0x0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = &PTR__exception_001b1ac8;
        puVar6[1] = "Could not read valid RSA key";
        __cxa_throw(puVar6,&sign_exception::typeinfo,std::exception::~exception);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(sig + 0x20));
      asn1::readDER((DER *)local_100,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120);
      auStack_198 = (undefined1  [8])0x0;
      certMetaData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      certMetaData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (*(undefined1 **)(certData._0_8_ + 8) == *(undefined1 **)(certData._0_8_ + 0x10))
      goto LAB_001762e0;
      uVar13 = 0;
      pvVar10 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                (*(undefined1 **)(certData._0_8_ + 8) + 0x20);
      goto LAB_001762ac;
    }
    pvVar16 = (void *)((long)pvVar16 + 1);
    sVar14 = sVar14 + 1;
  } while( true );
  SHA1_Init((SHA_CTX *)local_598);
  SHA1_Update((SHA_CTX *)local_598,(void *)uVar15,sVar14);
  SHA1_Final(local_518,(SHA_CTX *)local_598);
  base64_encode_abi_cxx11_((string *)local_100,local_518,0x14);
  uVar15 = *(undefined8 *)local_100;
  pDVar12 = *(pointer *)((long)local_100 + 8);
  uVar3 = *(undefined8 *)((long)local_100 + 0x14);
  *(undefined8 *)((long)pvVar16 + -0x14) = *(undefined8 *)((long)local_100 + 0xc);
  *(undefined8 *)((long)pvVar16 + -0xc) = uVar3;
  *(undefined8 *)((long)pvVar16 + -0x20) = uVar15;
  *(pointer *)((long)pvVar16 + -0x18) = pDVar12;
  uVar15 = pvVar16;
  if (local_100 != (undefined1  [8])&certData.children) {
    operator_delete((void *)local_100,
                    (ulong)&(certData.children.
                             super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
                             super__Vector_impl_data._M_start)->field_0x1);
  }
  goto LAB_00175d56;
LAB_001762ac:
  uVar8 = uVar13;
  if (uVar13 == 0) {
    uVar8 = *(uint *)&pvVar10[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
  }
  cVar2 = *(char *)&pvVar10[-2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (cVar2 == '\x02') {
    uVar13 = uVar8;
  }
  if ((cVar2 == '0') &&
     (*pvVar10[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start == '1')) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_198,pvVar10);
    if ((undefined1  [8])
        certMetaData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != auStack_198) {
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sigret = (uchar *)operator_new(0x400);
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = sigret;
      memset(sigret,0,0x400);
      pvVar10 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_144;
      RSA_sign(0x40,local_4f4 + 0x1c,0x14,sigret,(uint *)pvVar10,rsa);
      RSA_free(rsa);
      BIO_free_all(bp);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)(uint)local_144._0_4_);
      stack0xfffffffffffffb03 = 0x7010df78648862a;
      __l._M_len = 9;
      __l._M_array = sha + 0x13;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_488,__l,&local_35);
      asn1::mkBIN((vec8 *)((long)&certSF.field_2 + 8),'\x06',&local_488);
      asn1::mkINT(&local_440,1);
      local_4f4[0x12] = '+';
      local_4f4[0x13] = '\x0e';
      local_4f4[0x14] = '\x03';
      local_4f4[0x15] = '\x02';
      local_4f4[0x16] = 0x1a;
      __l_00._M_len = 5;
      __l_00._M_array = local_4f4 + 0x12;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_3e0,__l_00,&local_34);
      asn1::mkBIN(&local_3f8,'\x06',&local_3e0);
      asn1::mkNIL();
      pvVar18 = &local_3c8;
      asn1::
      mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_410,(asn1 *)0x30,(uint8_t)&local_3f8,pvVar18,pvVar10);
      asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_428,(asn1 *)0x31,(uint8_t)&local_410,pvVar18);
      local_4f4[0] = '*';
      local_4f4[1] = 0x86;
      local_4f4[2] = 'H';
      local_4f4[3] = 0x86;
      local_4f4[4] = 0xf7;
      local_4f4[5] = '\r';
      local_4f4[6] = '\x01';
      local_4f4[7] = '\a';
      local_4f4[8] = 1;
      __a = &local_33;
      __l_01._M_len = 9;
      __l_01._M_array = local_4f4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_380,__l_01,__a);
      asn1::mkBIN(&local_398,'\x06',&local_380);
      asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_3b0,(asn1 *)0x30,(uint8_t)&local_398,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
      asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_368,(asn1 *)0xa0,(uint8_t)local_120,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
      asn1::mkINT(&local_338,1);
      asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_308,(asn1 *)0x30,(uint8_t)auStack_198,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
      asn1::mkINT(&local_2f0,(ulong)uVar13);
      asn1::
      mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_320,(asn1 *)0x30,(uint8_t)&local_308,&local_2f0,pvVar10);
      local_4f4[0x17] = '+';
      local_4f4[0x18] = '\x0e';
      local_4f4[0x19] = '\x03';
      local_4f4[0x1a] = '\x02';
      local_4f4[0x1b] = 0x1a;
      __l_02._M_len = 5;
      __l_02._M_array = local_4f4 + 0x17;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_2a8,__l_02,&local_32);
      asn1::mkBIN(&local_2c0,'\x06',&local_2a8);
      asn1::mkNIL();
      asn1::
      mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_2d8,(asn1 *)0x30,(uint8_t)&local_2c0,&local_290,pvVar10);
      local_4f4[9] = '*';
      local_4f4[10] = 0x86;
      local_4f4[0xb] = 'H';
      local_4f4[0xc] = 0x86;
      local_4f4[0xd] = 0xf7;
      local_4f4[0xe] = '\r';
      local_4f4[0xf] = '\x01';
      local_4f4[0x10] = '\x01';
      local_4f4[0x11] = 1;
      __l_03._M_len = 9;
      __l_03._M_array = local_4f4 + 9;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_248,__l_03,&local_31);
      asn1::mkBIN(&local_260,'\x06',&local_248);
      asn1::mkNIL();
      asn1::
      mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_278,(asn1 *)0x30,(uint8_t)&local_260,&local_230,pvVar10);
      pvVar18 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x176660;
      asn1::mkBIN(&local_4a0,'\x04',
                  (vec8 *)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar10 = &local_320;
      asn1::
      mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_350,(asn1 *)0x30,(uint8_t)&local_338,pvVar10,&local_2d8,&local_278,
                 &local_4a0,pvVar18);
      v_4 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1766b2;
      asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_4b8,(asn1 *)0x31,(uint8_t)&local_350,pvVar10);
      pvVar10 = &local_428;
      pvVar18 = &local_3b0;
      asn1::
      mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_458,(asn1 *)0x30,(uint8_t)&local_440,pvVar10,pvVar18,&local_368,&local_4b8,
                 v_4);
      asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_470,(asn1 *)0xa0,(uint8_t)&local_458,pvVar10);
      asn1::
      mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &certMetaData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(asn1 *)0x30,
                 (char)&certSF + '\x18',&local_470,pvVar18);
      if (local_470.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_470.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_470.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_470.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_458.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_458.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_4b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_4b8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_4b8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_350.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_350.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_4a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_4a0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_4a0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_278.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_278.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_230.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_230.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_230.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_230.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_260.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_260.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_248.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_248.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2d8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_290.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_290.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_290.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_290.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2c0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2c0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_320.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_320.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_320.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_320.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2f0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2f0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_308.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_308.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_338.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_338.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_368.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_368.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_3b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_3b0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3b0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_398.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_398.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_380.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_380.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_380.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_380.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_428.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_428.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_428.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_428.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_410.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_410.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_410.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_410.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_3c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_3c8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3c8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_3f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_3e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_3e0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3e0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_440.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_440.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_440.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_440.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (certSF.field_2._8_8_ != 0) {
        operator_delete((void *)certSF.field_2._8_8_,
                        local_50._M_allocated_capacity - certSF.field_2._8_8_);
      }
      if (local_488.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_488.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_488.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_488.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar4 = crc32_fast(certMetaData.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                         (long)data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start -
                         (long)certMetaData.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      certSF.field_2._8_8_ = &local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&certSF.field_2 + 8),"META-INF/CERT.RSA","");
      ZipArchive::addFile(local_40,(string *)((long)&certSF.field_2 + 8),true,
                          (long)data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start -
                          (long)certMetaData.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start -
                          (long)certMetaData.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,0,uVar4,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)certSF.field_2._8_8_ != &local_50) {
        operator_delete((void *)certSF.field_2._8_8_,local_50._M_allocated_capacity + 1);
      }
      fwrite(certMetaData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,1,
             (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start -
             (long)certMetaData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,(FILE *)(local_40->f).fp_);
      if (certMetaData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(certMetaData.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)certMetaData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (ulong)(sigret + (0x400 - (long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         )));
      }
      if (auStack_198 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_198,
                        (long)certMetaData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_198);
      }
      if ((size_type *)
          certData.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != &certData.text._M_string_length) {
        operator_delete(certData.data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,certData.text._M_string_length + 1
                       );
      }
      if (certData.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(certData.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (long)certData.data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)certData.children.
                              super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      }
      std::vector<asn1::DER,_std::allocator<asn1::DER>_>::~vector
                ((vector<asn1::DER,_std::allocator<asn1::DER>_> *)&certData);
      if (local_120 != (undefined1  [8])0x0) {
        operator_delete((void *)local_120,
                        (long)certificate.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)local_120);
      }
      if ((size_type *)certData.value != &pemKey._M_string_length) {
        operator_delete((void *)certData.value,pemKey._M_string_length + 1);
      }
      if (stack0xfffffffffffffec0 != (vector<asn1::DER,_std::allocator<asn1::DER>_> *)0x0) {
        operator_delete(stack0xfffffffffffffec0,
                        manifestMF.field_2._8_8_ - (long)stack0xfffffffffffffec0);
      }
      if ((size_type *)pemKey.field_2._8_8_ != &certSF._M_string_length) {
        operator_delete((void *)pemKey.field_2._8_8_,certSF._M_string_length + 1);
      }
      if (local_218 != &sigHead._M_string_length) {
        operator_delete(local_218,sigHead._M_string_length + 1);
      }
      if (sigHead.field_2._8_8_ != 0) {
        operator_delete((void *)sigHead.field_2._8_8_,
                        (long)digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish - sigHead.field_2._8_8_);
      }
      if ((size_type *)head.field_2._8_8_ != &manifestMF._M_string_length) {
        operator_delete((void *)head.field_2._8_8_,manifestMF._M_string_length + 1);
      }
      psVar7 = &head._M_string_length;
      if ((size_type *)
          digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage != psVar7) {
        operator_delete(digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,head._M_string_length + 1);
        psVar7 = extraout_RAX;
      }
      return (int)psVar7;
    }
    goto LAB_001762e0;
  }
  pvVar18 = pvVar10 + 2;
  pvVar10 = pvVar10 + 4;
  if (&(pvVar18->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage ==
      (pointer *)*(undefined1 **)(certData._0_8_ + 0x10)) {
LAB_001762e0:
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar6 = &PTR__exception_001b1ac8;
    puVar6[1] = "Could not extract certificate from keystore";
    __cxa_throw(puVar6,&sign_exception::typeinfo,std::exception::~exception);
  }
  goto LAB_001762ac;
}

Assistant:

void sign(ZipArchive& zipArchive, KeyStore& keyStore, const string& digestFile)
{
    SHA_CTX context;
    string head = "Manifest-Version: 1.0\015\012Created-By: 1.0 "
                  "(Fastzip)\015\012\015\012";

    string manifestMF = head + digestFile;
    uint8_t manifestSha[SHA_LEN];
    SHA1_Init(&context);
    SHA1_Update(&context, manifestMF.c_str(), manifestMF.length());
    SHA1_Final(manifestSha, &context);

    uint32_t checksum = crc32_fast(manifestMF.c_str(), manifestMF.length());
    zipArchive.addFile("META-INF/MANIFEST.MF", true, manifestMF.length(),
                       manifestMF.length(), 0, checksum);
    zipArchive.write((uint8_t*)manifestMF.c_str(), manifestMF.length());

    unsigned char sha[SHA_LEN];

    vector<char> digestCopy(digestFile.length() + 1);
    strcpy(&digestCopy[0], digestFile.c_str());

    char* digestPtr = &digestCopy[0];
    while (true) {
        char* ptr = digestPtr;

        while (*ptr) {
            if (ptr[0] == 0x0d && ptr[1] == 0xa && ptr[2] == 0x0d &&
                ptr[3] == 0x0a)
                break;
            ptr++;
        }

        if (!*ptr)
            break;

        ptr += 4;

        SHA1_Init(&context);
        SHA1_Update(&context, digestPtr, ptr - digestPtr);
        SHA1_Final(sha, &context);
        memcpy(ptr - 32, base64_encode(sha, SHA_LEN).c_str(), 28);

        digestPtr = ptr;
    }
    const string sigHead = "Signature-Version: 1.0\015\012Created-By: 1.0 "
                           "(Fastzip)\015\012SHA1-Digest-Manifest: ";

    string certSF = sigHead + base64_encode(manifestSha, SHA_LEN) +
                    "\015\012\015\012" + string(&digestCopy[0]);

    checksum = crc32_fast(certSF.c_str(), certSF.length());
    zipArchive.addFile("META-INF/CERT.SF", true, certSF.length(),
                       certSF.length(), 0, checksum);
    zipArchive.write((uint8_t*)certSF.c_str(), certSF.length());

    unsigned char digest[SHA_LEN];
    memset(digest, 0, SHA_LEN);

    SHA1_Init(&context);
    SHA1_Update(&context, certSF.c_str(), certSF.size());
    SHA1_Final(digest, &context);

    vector<uint8_t> key;
    try {
        key = keyStore.getKey();
    } catch (key_exception& ke) {
        throw sign_exception(ke);
    }

    string pemKey = toPem(key);
    BIO* bio = BIO_new_mem_buf((void*)pemKey.c_str(), -1);
    RSA* rsa = PEM_read_bio_RSAPrivateKey(bio, NULL, NULL, NULL);
    if (rsa == nullptr)
        throw sign_exception("Could not read valid RSA key");

    vector<uint8_t> certificate = keyStore.getCert();

    // Extract the meta data
    DER certData = readDER(certificate);

    vector<uint8_t> certMetaData;
    uint32_t timeStamp = 0;
    for (auto& cd : certData[0]) {
        if (cd.tag == 0x02 && timeStamp == 0) {
            timeStamp = cd.value;
        }
        if (cd.tag == 0x30 && cd[0].tag == 0x31) {
            certMetaData = cd.data;
            break;
        }
    }

    if (certMetaData.size() == 0)
        throw sign_exception("Could not extract certificate from keystore");

    vector<uint8_t> sign(1024);
    unsigned int signLen;

    RSA_sign(NID_sha1, digest, SHA_LEN, &sign[0], &signLen, rsa);

    RSA_free(rsa);

    BIO_free_all(bio);

    sign.resize(signLen);
    // clang-format off
    auto data =
        mkSEQ(0x30,
            // PKCS7 SIGNED
            mkBIN(0x6, { 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x07, 0x02 }),
            mkSEQ(0xA0,
                mkSEQ(0x30,
                    mkINT(1),
                    mkSEQ(0x31,
                        mkSEQ(0x30,
                            // SHA1
                            mkBIN(0x6, { 0x2b, 0x0e, 0x03, 0x02, 0x1a }),
                            mkNIL()
                            )
                        ),
                    mkSEQ(0x30,
                        // PKC7
                        mkBIN(0x6, { 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x07, 0x01 })
                        ),
                    mkSEQ(0xA0, certificate),
                    mkSEQ(0x31,
                        mkSEQ(0x30,
                            mkINT(1),
                            mkSEQ(0x30,
                                mkSEQ(0x30, certMetaData),
                                mkINT(timeStamp)
                                ),
                            mkSEQ(0x30,
                                // SHA1
                                mkBIN(0x6, { 0x2b, 0xe, 0x3, 0x2, 0x1a}),
                                mkNIL()
                                ),
                            mkSEQ(0x30,
                                // RSA ENCRYPTION,
                                mkBIN(0x6, {0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01, 0x01 }),
                                mkNIL()
                                ),
                            mkBIN(0x04, sign)
                            )
                        )
                    )
                )
            );
	// clang-format off
    checksum = crc32_fast(&data[0], data.size());
    zipArchive.addFile("META-INF/CERT.RSA", true, data.size(), data.size(), 0, checksum);
    zipArchive.write(&data[0], data.size());
}